

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_read.cpp
# Opt level: O0

char * hatoui(char *first,char *last,uint *out)

{
  long lVar1;
  bool bVar2;
  int *in_RDX;
  char *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  int digit;
  uint result;
  int in_stack_ffffffffffffffcc;
  int local_28;
  int local_24;
  char *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = 0;
  for (local_10 = in_RDI; local_10 != in_RSI; local_10 = local_10 + 1) {
    bVar2 = json_isdigit(in_stack_ffffffffffffffcc);
    if (bVar2) {
      local_28 = *local_10 + -0x30;
    }
    else if ((*local_10 < 'a') || ('f' < *local_10)) {
      if ((*local_10 < 'A') || ('F' < *local_10)) break;
      local_28 = *local_10 + -0x37;
    }
    else {
      local_28 = *local_10 + -0x57;
    }
    local_24 = local_24 * 0x10 + local_28;
  }
  *in_RDX = local_24;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

static const char *hatoui(const char *first, const char *last,
                          unsigned int& out)
{
    unsigned int result = 0;
    for (; first != last; ++first)
    {
        int digit;
        if (json_isdigit(*first))
            digit = *first - '0';

        else if (*first >= 'a' && *first <= 'f')
            digit = *first - 'a' + 10;

        else if (*first >= 'A' && *first <= 'F')
            digit = *first - 'A' + 10;

        else
            break;

        result = 16 * result + digit;
    }
    out = result;

    return first;
}